

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enum_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::ImmutableEnumFieldLiteGenerator::GenerateFieldInfo
          (ImmutableEnumFieldLiteGenerator *this,Printer *printer,
          vector<unsigned_short,_std::allocator<unsigned_short>_> *output)

{
  FieldDescriptor *descriptor;
  string_view terminating_string;
  vector<unsigned_short,_std::allocator<unsigned_short>_> *pvVar1;
  bool bVar2;
  int iVar3;
  basic_string_view<char,_std::char_traits<char>_> local_50;
  string_view local_40;
  string_view local_30;
  vector<unsigned_short,_std::allocator<unsigned_short>_> *local_20;
  vector<unsigned_short,_std::allocator<unsigned_short>_> *output_local;
  Printer *printer_local;
  ImmutableEnumFieldLiteGenerator *this_local;
  
  local_20 = output;
  output_local = (vector<unsigned_short,_std::allocator<unsigned_short>_> *)printer;
  printer_local = (Printer *)this;
  iVar3 = FieldDescriptor::number(this->descriptor_);
  WriteIntToUtf16CharSequence(iVar3,local_20);
  iVar3 = GetExperimentalJavaFieldType(this->descriptor_);
  WriteIntToUtf16CharSequence(iVar3,local_20);
  bVar2 = HasHasbit(this->descriptor_);
  if (bVar2) {
    WriteIntToUtf16CharSequence(this->messageBitIndex_,local_20);
  }
  pvVar1 = output_local;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_30,"\"$name$_\",\n");
  protobuf::io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            ((Printer *)pvVar1,&this->variables_,local_30);
  bVar2 = SupportUnknownEnumValue(this->descriptor_);
  pvVar1 = output_local;
  if (!bVar2) {
    descriptor = this->descriptor_;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_40,"$type$");
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_50,",\n");
    bVar2 = Context::EnforceLite(this->context_);
    terminating_string._M_str = local_50._M_str;
    terminating_string._M_len = local_50._M_len;
    PrintEnumVerifierLogic
              ((Printer *)pvVar1,descriptor,&this->variables_,local_40,terminating_string,bVar2);
  }
  return;
}

Assistant:

void ImmutableEnumFieldLiteGenerator::GenerateFieldInfo(
    io::Printer* printer, std::vector<uint16_t>* output) const {
  WriteIntToUtf16CharSequence(descriptor_->number(), output);
  WriteIntToUtf16CharSequence(GetExperimentalJavaFieldType(descriptor_),
                              output);
  if (HasHasbit(descriptor_)) {
    WriteIntToUtf16CharSequence(messageBitIndex_, output);
  }
  printer->Print(variables_, "\"$name$_\",\n");
  if (!SupportUnknownEnumValue((descriptor_))) {
    PrintEnumVerifierLogic(printer, descriptor_, variables_,
                           /*var_name=*/"$type$",
                           /*terminating_string=*/",\n",
                           /*enforce_lite=*/context_->EnforceLite());
  }
}